

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_set_byte_Test::TestBody
          (ByteBufferTest_test_set_byte_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_118;
  Message local_110;
  uchar local_105;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_4;
  Message local_e8;
  uchar local_dd;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  Message local_c0;
  uchar local_b5;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  uchar local_8d;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  uchar local_65;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_40 [8];
  ByteBuffer buff;
  ByteBufferTest_test_set_byte_Test *this_local;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,5);
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_40,'\0');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_40,'\x01');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_40,'\x02');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_40,'\x03');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_40,'\x04');
  local_64 = 5;
  local_65 = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_60,"5","buff.ReadByte()",&local_64,&local_65);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_8c = 3;
  local_8d = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_88,"3","buff.ReadByte()",&local_8c,&local_8d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_b4 = 1;
  local_b5 = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_b0,"1","buff.ReadByte()",&local_b4,&local_b5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_dc = 7;
  local_dd = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_d8,"7","buff.ReadByte()",&local_dc,&local_dd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_104 = 9;
  local_105 = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_100,"9","buff.ReadByte()",&local_104,&local_105);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(ByteBufferTest, test_set_byte)
{
    ByteBuffer buff(5);
    buff.SetByte(0, 5);
    buff.SetByte(1, 3);
    buff.SetByte(2, 1);
    buff.SetByte(3, 7);
    buff.SetByte(4, 9);
    EXPECT_EQ(5, buff.ReadByte());
    EXPECT_EQ(3, buff.ReadByte());
    EXPECT_EQ(1, buff.ReadByte());
    EXPECT_EQ(7, buff.ReadByte());
    EXPECT_EQ(9, buff.ReadByte());
}